

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMagic.cpp
# Opt level: O0

void testMagic(string *param_1)

{
  ostream *poVar1;
  exception *e;
  bool in_stack_0000003d;
  bool in_stack_0000003e;
  undefined1 in_stack_0000003f;
  undefined1 in_stack_000001ff;
  char *in_stack_00000200;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing magic number");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_151a19::testFile1(in_stack_00000200,(bool)in_stack_000001ff);
  anon_unknown.dwarf_151a19::testFile1(in_stack_00000200,(bool)in_stack_000001ff);
  anon_unknown.dwarf_151a19::testFile2
            ((char *)param_1,(bool)in_stack_0000003f,in_stack_0000003e,in_stack_0000003d);
  anon_unknown.dwarf_151a19::testFile2
            ((char *)param_1,(bool)in_stack_0000003f,in_stack_0000003e,in_stack_0000003d);
  anon_unknown.dwarf_151a19::testFile2
            ((char *)param_1,(bool)in_stack_0000003f,in_stack_0000003e,in_stack_0000003d);
  anon_unknown.dwarf_151a19::testFile2
            ((char *)param_1,(bool)in_stack_0000003f,in_stack_0000003e,in_stack_0000003d);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testMagic (const std::string&)
{
    try
    {
        cout << "Testing magic number" << endl;

        testFile1 (ILM_IMF_TEST_IMAGEDIR "comp_none.exr", true);
        testFile1 (ILM_IMF_TEST_IMAGEDIR "invalid.exr", false);

        testFile2 (ILM_IMF_TEST_IMAGEDIR "tiled.exr", true, true, true);
        testFile2 (ILM_IMF_TEST_IMAGEDIR "comp_none.exr", true, true, false);
        testFile2 (ILM_IMF_TEST_IMAGEDIR "invalid.exr", true, false, false);
        testFile2 (
            ILM_IMF_TEST_IMAGEDIR "does_not_exist.exr", false, false, false);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}